

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dtypes.h
# Opt level: O1

void __thiscall EventInfo::EventInfo(EventInfo *this)

{
  char *__end;
  
  (this->label)._M_dataplus._M_p = (pointer)&(this->label).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"","");
  (this->context)._M_dataplus._M_p = (pointer)&(this->context).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->context,"","");
  this->time_minutes = 0.0;
  this->time_seconds = 0.0;
  return;
}

Assistant:

EventInfo() :
		label (""),
		context (""),
		time_minutes (0.f),
		time_seconds (0.f)
	{}